

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::FeLagrangeO3Tria<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,FeLagrangeO3Tria<double> *this,
          MatrixXd *refcoords)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  Index IVar4;
  undefined8 *puVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  double dVar9;
  PointerType pdVar10;
  Array<double,_1,__1,_1,_1,__1> lambda1;
  Array<double,_1,__1,_1,_1,__1> lambda2;
  Array<double,_1,__1,_1,_1,__1> lambda0;
  stringstream ss;
  scalar_difference_op<double,_double> local_361;
  PointerType local_360;
  undefined1 local_358 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  variable_if_dynamic<long,__1> local_338;
  variable_if_dynamic<long,__1> vStack_330;
  Index local_328;
  PointerType local_318;
  scalar_constant_op<double> local_310;
  PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_> local_308;
  PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_> local_2f8;
  Rhs local_2e0;
  double local_2d0;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_2c8;
  undefined1 local_290 [32];
  variable_if_dynamic<long,__1> local_270;
  variable_if_dynamic<long,__1> vStack_268;
  Index local_260;
  undefined1 local_258 [16];
  scalar_constant_op<double> local_248;
  scalar_constant_op<double> sStack_240;
  variable_if_dynamic<long,__1> local_238;
  variable_if_dynamic<long,__1> vStack_230;
  Index local_228;
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  scalar_constant_op<double> local_200;
  variable_if_dynamic<long,__1> vStack_1f8;
  variable_if_dynamic<long,__1> local_1f0;
  undefined1 local_1b8 [16];
  variable_if_dynamic<long,__1> local_1a8;
  variable_if_dynamic<long,__1> vStack_1a0;
  scalar_constant_op<double> local_198;
  scalar_constant_op<double> sStack_190;
  RhsNested local_188;
  XprTypeNested local_178;
  variable_if_dynamic<long,__1> local_168;
  scalar_constant_op<double> local_160;
  scalar_constant_op<double> local_150;
  LhsNested local_148;
  scalar_constant_op<double> local_130;
  
  if ((refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      != 2) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Reference coordinates must be 2-vectors",0x27);
    pdVar10 = (PointerType)(local_220 + 0x10);
    local_220._0_8_ = pdVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"refcoords.rows() == 2","");
    local_358._0_8_ = &local_348;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_220,(string *)local_358,0x3f4,(string *)local_290);
    if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._0_8_ != &local_348) {
      operator_delete((void *)local_358._0_8_,local_348._M_allocated_capacity + 1);
    }
    if ((PointerType)local_220._0_8_ != pdVar10) {
      operator_delete((void *)local_220._0_8_,local_210._M_allocated_capacity + 1);
    }
    local_220._0_8_ = pdVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"false","");
    local_358._0_8_ = &local_348;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,"");
    local_290._0_8_ = local_290 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"");
    base::AssertionFailed((string *)local_220,(string *)local_358,0x3f4,(string *)local_290);
    std::__cxx11::string::~string((string *)local_290);
    std::__cxx11::string::~string((string *)local_358);
    std::__cxx11::string::~string((string *)local_220);
    abort();
  }
  IVar4 = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,10,(ulong)(uint)IVar4
            );
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_290,
             refcoords,0);
  local_328 = local_260;
  local_338.m_value = local_270.m_value;
  vStack_330.m_value = vStack_268.m_value;
  local_348._M_allocated_capacity = local_290._16_8_;
  local_348._8_8_ = local_290._24_8_;
  local_358._0_8_ = local_290._0_8_;
  local_358._8_8_ = local_290._8_8_;
  local_2c8.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)0x3ff0000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_258,1,local_290._16_8_,(scalar_constant_op<double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                   *)local_220,(Lhs *)local_258,(Rhs *)local_358,
                  (scalar_difference_op<double,_double> *)&local_308);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            (&local_2c8,refcoords,1);
  local_228 = local_2c8.
              super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
              .m_outerStride;
  local_238.m_value =
       local_2c8.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       m_startRow.m_value;
  vStack_230.m_value =
       local_2c8.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       m_startCol.m_value;
  local_248.m_other =
       (double)local_2c8.
               super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
               .m_cols.m_value;
  sStack_240.m_other =
       (double)local_2c8.
               super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
               .m_xpr;
  local_258._0_8_ =
       local_2c8.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
       m_data;
  local_258._8_8_ =
       local_2c8.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
       _8_8_;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                   *)local_1b8,(Lhs *)local_220,(Rhs *)local_258,
                  (scalar_difference_op<double,_double> *)&local_308);
  Eigen::PlainObjectBase<Eigen::Array<double,1,-1,1,1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>>
            ((PlainObjectBase<Eigen::Array<double,1,_1,1,1,_1>> *)&local_2e0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
              *)local_1b8);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_220,
             refcoords,0);
  local_1a8.m_value = local_210._M_allocated_capacity;
  vStack_1a0.m_value = local_210._8_8_;
  local_188 = (RhsNested)local_1f0.m_value;
  local_198.m_other = local_200.m_other;
  sStack_190.m_other = (double)vStack_1f8.m_value;
  local_1b8._0_8_ = local_220._0_8_;
  local_1b8._8_8_ = local_220._8_8_;
  local_308.m_storage.m_data = (double *)0x0;
  local_308.m_storage.m_cols = 0;
  if ((local_210._M_allocated_capacity != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
             SEXT816((long)local_210._M_allocated_capacity),0) < 1)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = execv;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Array<double,_1,_-1,_1,_1,_-1>_>::resize
            (&local_308,1,local_210._M_allocated_capacity);
  pdVar10 = (PointerType)local_1b8._0_8_;
  lVar1 = *(long *)(vStack_1a0.m_value + 8);
  Eigen::internal::
  resize_if_allowed<Eigen::Array<double,1,_1,1,1,_1>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>,double,double>
            ((Array<double,_1,__1,_1,_1,__1> *)&local_308,
             (ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)local_1b8,(assign_op<double,_double> *)local_358);
  if (0 < local_308.m_storage.m_cols) {
    lVar8 = 0;
    do {
      local_308.m_storage.m_data[lVar8] = *pdVar10;
      lVar8 = lVar8 + 1;
      pdVar10 = pdVar10 + lVar1;
    } while (local_308.m_storage.m_cols != lVar8);
  }
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_220,
             refcoords,1);
  local_1a8.m_value = local_210._M_allocated_capacity;
  vStack_1a0.m_value = local_210._8_8_;
  local_188 = (RhsNested)local_1f0.m_value;
  local_198.m_other = local_200.m_other;
  sStack_190.m_other = (double)vStack_1f8.m_value;
  local_1b8._0_8_ = local_220._0_8_;
  local_1b8._8_8_ = local_220._8_8_;
  local_2f8.m_storage.m_data = (double *)0x0;
  local_2f8.m_storage.m_cols = 0;
  if ((local_210._M_allocated_capacity != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
             SEXT816((long)local_210._M_allocated_capacity),0) < 1)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = execv;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Array<double,_1,_-1,_1,_1,_-1>_>::resize
            (&local_2f8,1,local_210._M_allocated_capacity);
  pdVar10 = (PointerType)local_1b8._0_8_;
  lVar1 = *(long *)(vStack_1a0.m_value + 8);
  Eigen::internal::
  resize_if_allowed<Eigen::Array<double,1,_1,1,1,_1>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>,double,double>
            ((Array<double,_1,__1,_1,_1,__1> *)&local_2f8,
             (ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)local_1b8,(assign_op<double,_double> *)local_358);
  if (0 < local_2f8.m_storage.m_cols) {
    lVar8 = 0;
    do {
      local_2f8.m_storage.m_data[lVar8] = *pdVar10;
      lVar8 = lVar8 + 1;
      pdVar10 = pdVar10 + lVar1;
    } while (local_2f8.m_storage.m_cols != lVar8);
  }
  local_258._0_8_ = (PointerType)0x4012000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,
                   local_2e0.super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>.m_storage
                   .m_cols,(scalar_constant_op<double> *)local_258);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_290,(Lhs *)local_358,&local_2e0,
                  (scalar_product_op<double,_double> *)&local_2c8);
  local_2c8.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)&DAT_3fd5555555555555;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,
                   local_2e0.super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>.m_storage
                   .m_cols,(scalar_constant_op<double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)local_258,&local_2e0,(Rhs *)local_358,
                  (scalar_difference_op<double,_double> *)&local_310);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                   *)local_220,(Lhs *)local_290,(Rhs *)local_258,
                  (scalar_product_op<double,_double> *)local_358);
  local_310.m_other = 0.6666666666666666;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,
                   local_2e0.super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>.m_storage
                   .m_cols,&local_310);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)&local_2c8,&local_2e0,(Rhs *)local_358,&local_361);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                   *)local_1b8,(Lhs *)local_220,(Rhs *)&local_2c8,
                  (scalar_product_op<double,_double> *)local_358);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             __return_storage_ptr__,0);
  local_360 = (PointerType)sStack_190.m_other;
  pdVar2 = (local_188->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  pdVar3 = (local_178->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  local_318 = (PointerType)local_160.m_other;
  pdVar7 = (local_148->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  local_2d0 = local_130.m_other;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>,double,double>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
              *)local_1b8,(assign_op<double,_double> *)&local_310);
  if (0 < (long)local_348._M_allocated_capacity) {
    lVar1 = *(Index *)(local_348._8_8_ + 8);
    dVar9 = 0.0;
    pdVar6 = (double *)local_358._0_8_;
    do {
      *pdVar6 = (pdVar7[(long)dVar9] - local_2d0) *
                (pdVar3[(long)dVar9] - (double)local_318) * pdVar2[(long)dVar9] * (double)local_360;
      dVar9 = (double)((long)dVar9 + 1);
      pdVar6 = pdVar6 + lVar1;
    } while ((double)local_348._M_allocated_capacity != dVar9);
  }
  local_258._0_8_ = (PointerType)0x4012000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_308.m_storage.m_cols,(scalar_constant_op<double> *)local_258
                  );
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_290,(Lhs *)local_358,(Rhs *)&local_308,
                  (scalar_product_op<double,_double> *)&local_2c8);
  local_2c8.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)&DAT_3fd5555555555555;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_308.m_storage.m_cols,
                   (scalar_constant_op<double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)local_258,(Lhs *)&local_308,(Rhs *)local_358,
                  (scalar_difference_op<double,_double> *)&local_310);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                   *)local_220,(Lhs *)local_290,(Rhs *)local_258,
                  (scalar_product_op<double,_double> *)local_358);
  local_310.m_other = 0.6666666666666666;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_308.m_storage.m_cols,&local_310);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)&local_2c8,(Lhs *)&local_308,(Rhs *)local_358,&local_361);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                   *)local_1b8,(Lhs *)local_220,(Rhs *)&local_2c8,
                  (scalar_product_op<double,_double> *)local_358);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             __return_storage_ptr__,1);
  local_360 = (PointerType)sStack_190.m_other;
  pdVar2 = (local_188->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  pdVar3 = (local_178->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  local_318 = (PointerType)local_160.m_other;
  pdVar7 = (local_148->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  local_2d0 = local_130.m_other;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>,double,double>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
              *)local_1b8,(assign_op<double,_double> *)&local_310);
  if (0 < (long)local_348._M_allocated_capacity) {
    lVar1 = *(Index *)(local_348._8_8_ + 8);
    dVar9 = 0.0;
    pdVar6 = (double *)local_358._0_8_;
    do {
      *pdVar6 = (pdVar7[(long)dVar9] - local_2d0) *
                (pdVar3[(long)dVar9] - (double)local_318) * pdVar2[(long)dVar9] * (double)local_360;
      dVar9 = (double)((long)dVar9 + 1);
      pdVar6 = pdVar6 + lVar1;
    } while ((double)local_348._M_allocated_capacity != dVar9);
  }
  local_258._0_8_ = (PointerType)0x4012000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_2f8.m_storage.m_cols,(scalar_constant_op<double> *)local_258
                  );
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_290,(Lhs *)local_358,(Rhs *)&local_2f8,
                  (scalar_product_op<double,_double> *)&local_2c8);
  local_2c8.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)&DAT_3fd5555555555555;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_2f8.m_storage.m_cols,
                   (scalar_constant_op<double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)local_258,(Lhs *)&local_2f8,(Rhs *)local_358,
                  (scalar_difference_op<double,_double> *)&local_310);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                   *)local_220,(Lhs *)local_290,(Rhs *)local_258,
                  (scalar_product_op<double,_double> *)local_358);
  local_310.m_other = 0.6666666666666666;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_2f8.m_storage.m_cols,&local_310);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)&local_2c8,(Lhs *)&local_2f8,(Rhs *)local_358,&local_361);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                   *)local_1b8,(Lhs *)local_220,(Rhs *)&local_2c8,
                  (scalar_product_op<double,_double> *)local_358);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             __return_storage_ptr__,2);
  local_360 = (PointerType)sStack_190.m_other;
  pdVar2 = (local_188->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  pdVar3 = (local_178->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  local_318 = (PointerType)local_160.m_other;
  pdVar7 = (local_148->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  local_2d0 = local_130.m_other;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>,double,double>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
              *)local_1b8,(assign_op<double,_double> *)&local_310);
  if (0 < (long)local_348._M_allocated_capacity) {
    lVar1 = *(Index *)(local_348._8_8_ + 8);
    dVar9 = 0.0;
    pdVar6 = (double *)local_358._0_8_;
    do {
      *pdVar6 = (pdVar7[(long)dVar9] - local_2d0) *
                (pdVar3[(long)dVar9] - (double)local_318) * pdVar2[(long)dVar9] * (double)local_360;
      dVar9 = (double)((long)dVar9 + 1);
      pdVar6 = pdVar6 + lVar1;
    } while ((double)local_348._M_allocated_capacity != dVar9);
  }
  local_258._0_8_ = &DAT_402b000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,
                   local_2e0.super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>.m_storage
                   .m_cols,(scalar_constant_op<double> *)local_258);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_290,(Lhs *)local_358,&local_2e0,
                  (scalar_product_op<double,_double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_220,(Lhs *)local_290,(Rhs *)&local_308,
                  (scalar_product_op<double,_double> *)local_358);
  local_2c8.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)&DAT_3fd5555555555555;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,
                   local_2e0.super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>.m_storage
                   .m_cols,(scalar_constant_op<double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)local_258,&local_2e0,(Rhs *)local_358,
                  (scalar_difference_op<double,_double> *)&local_310);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                   *)local_1b8,(Lhs *)local_220,(Rhs *)local_258,
                  (scalar_product_op<double,_double> *)local_358);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             __return_storage_ptr__,3);
  local_360 = (PointerType)sStack_190.m_other;
  pdVar2 = (local_188->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  pdVar3 = (local_178->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar1 = *local_168.m_value;
  local_318 = (PointerType)local_150.m_other;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>,double,double>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
              *)local_1b8,(assign_op<double,_double> *)&local_2c8);
  if (0 < (long)local_348._M_allocated_capacity) {
    lVar8 = *(Index *)(local_348._8_8_ + 8);
    dVar9 = 0.0;
    pdVar7 = (double *)local_358._0_8_;
    do {
      *pdVar7 = (*(double *)(lVar1 + (long)dVar9 * 8) - (double)local_318) *
                pdVar2[(long)dVar9] * (double)local_360 * pdVar3[(long)dVar9];
      dVar9 = (double)((long)dVar9 + 1);
      pdVar7 = pdVar7 + lVar8;
    } while ((double)local_348._M_allocated_capacity != dVar9);
  }
  local_258._0_8_ = &DAT_402b000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,
                   local_2e0.super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>.m_storage
                   .m_cols,(scalar_constant_op<double> *)local_258);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_290,(Lhs *)local_358,&local_2e0,
                  (scalar_product_op<double,_double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_220,(Lhs *)local_290,(Rhs *)&local_308,
                  (scalar_product_op<double,_double> *)local_358);
  local_2c8.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)&DAT_3fd5555555555555;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_308.m_storage.m_cols,
                   (scalar_constant_op<double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)local_258,(Lhs *)&local_308,(Rhs *)local_358,
                  (scalar_difference_op<double,_double> *)&local_310);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                   *)local_1b8,(Lhs *)local_220,(Rhs *)local_258,
                  (scalar_product_op<double,_double> *)local_358);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             __return_storage_ptr__,4);
  local_360 = (PointerType)sStack_190.m_other;
  pdVar2 = (local_188->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  pdVar3 = (local_178->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar1 = *local_168.m_value;
  local_318 = (PointerType)local_150.m_other;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>,double,double>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
              *)local_1b8,(assign_op<double,_double> *)&local_2c8);
  if (0 < (long)local_348._M_allocated_capacity) {
    lVar8 = *(Index *)(local_348._8_8_ + 8);
    dVar9 = 0.0;
    pdVar7 = (double *)local_358._0_8_;
    do {
      *pdVar7 = (*(double *)(lVar1 + (long)dVar9 * 8) - (double)local_318) *
                pdVar2[(long)dVar9] * (double)local_360 * pdVar3[(long)dVar9];
      dVar9 = (double)((long)dVar9 + 1);
      pdVar7 = pdVar7 + lVar8;
    } while ((double)local_348._M_allocated_capacity != dVar9);
  }
  local_258._0_8_ = &DAT_402b000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_308.m_storage.m_cols,(scalar_constant_op<double> *)local_258
                  );
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_290,(Lhs *)local_358,(Rhs *)&local_308,
                  (scalar_product_op<double,_double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_220,(Lhs *)local_290,(Rhs *)&local_2f8,
                  (scalar_product_op<double,_double> *)local_358);
  local_2c8.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)&DAT_3fd5555555555555;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_308.m_storage.m_cols,
                   (scalar_constant_op<double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)local_258,(Lhs *)&local_308,(Rhs *)local_358,
                  (scalar_difference_op<double,_double> *)&local_310);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                   *)local_1b8,(Lhs *)local_220,(Rhs *)local_258,
                  (scalar_product_op<double,_double> *)local_358);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             __return_storage_ptr__,5);
  local_360 = (PointerType)sStack_190.m_other;
  pdVar2 = (local_188->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  pdVar3 = (local_178->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar1 = *local_168.m_value;
  local_318 = (PointerType)local_150.m_other;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>,double,double>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
              *)local_1b8,(assign_op<double,_double> *)&local_2c8);
  if (0 < (long)local_348._M_allocated_capacity) {
    lVar8 = *(Index *)(local_348._8_8_ + 8);
    dVar9 = 0.0;
    pdVar7 = (double *)local_358._0_8_;
    do {
      *pdVar7 = (*(double *)(lVar1 + (long)dVar9 * 8) - (double)local_318) *
                pdVar2[(long)dVar9] * (double)local_360 * pdVar3[(long)dVar9];
      dVar9 = (double)((long)dVar9 + 1);
      pdVar7 = pdVar7 + lVar8;
    } while ((double)local_348._M_allocated_capacity != dVar9);
  }
  local_258._0_8_ = &DAT_402b000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_308.m_storage.m_cols,(scalar_constant_op<double> *)local_258
                  );
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_290,(Lhs *)local_358,(Rhs *)&local_308,
                  (scalar_product_op<double,_double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_220,(Lhs *)local_290,(Rhs *)&local_2f8,
                  (scalar_product_op<double,_double> *)local_358);
  local_2c8.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)&DAT_3fd5555555555555;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_2f8.m_storage.m_cols,
                   (scalar_constant_op<double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)local_258,(Lhs *)&local_2f8,(Rhs *)local_358,
                  (scalar_difference_op<double,_double> *)&local_310);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                   *)local_1b8,(Lhs *)local_220,(Rhs *)local_258,
                  (scalar_product_op<double,_double> *)local_358);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             __return_storage_ptr__,6);
  local_360 = (PointerType)sStack_190.m_other;
  pdVar2 = (local_188->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  pdVar3 = (local_178->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar1 = *local_168.m_value;
  local_318 = (PointerType)local_150.m_other;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>,double,double>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
              *)local_1b8,(assign_op<double,_double> *)&local_2c8);
  if (0 < (long)local_348._M_allocated_capacity) {
    lVar8 = *(Index *)(local_348._8_8_ + 8);
    dVar9 = 0.0;
    pdVar7 = (double *)local_358._0_8_;
    do {
      *pdVar7 = (*(double *)(lVar1 + (long)dVar9 * 8) - (double)local_318) *
                pdVar2[(long)dVar9] * (double)local_360 * pdVar3[(long)dVar9];
      dVar9 = (double)((long)dVar9 + 1);
      pdVar7 = pdVar7 + lVar8;
    } while ((double)local_348._M_allocated_capacity != dVar9);
  }
  local_258._0_8_ = &DAT_402b000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_2f8.m_storage.m_cols,(scalar_constant_op<double> *)local_258
                  );
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_290,(Lhs *)local_358,(Rhs *)&local_2f8,
                  (scalar_product_op<double,_double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_220,(Lhs *)local_290,&local_2e0,
                  (scalar_product_op<double,_double> *)local_358);
  local_2c8.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)&DAT_3fd5555555555555;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_2f8.m_storage.m_cols,
                   (scalar_constant_op<double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)local_258,(Lhs *)&local_2f8,(Rhs *)local_358,
                  (scalar_difference_op<double,_double> *)&local_310);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                   *)local_1b8,(Lhs *)local_220,(Rhs *)local_258,
                  (scalar_product_op<double,_double> *)local_358);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             __return_storage_ptr__,7);
  local_360 = (PointerType)sStack_190.m_other;
  pdVar2 = (local_188->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  pdVar3 = (local_178->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar1 = *local_168.m_value;
  local_318 = (PointerType)local_150.m_other;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>,double,double>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
              *)local_1b8,(assign_op<double,_double> *)&local_2c8);
  if (0 < (long)local_348._M_allocated_capacity) {
    lVar8 = *(Index *)(local_348._8_8_ + 8);
    dVar9 = 0.0;
    pdVar7 = (double *)local_358._0_8_;
    do {
      *pdVar7 = (*(double *)(lVar1 + (long)dVar9 * 8) - (double)local_318) *
                pdVar2[(long)dVar9] * (double)local_360 * pdVar3[(long)dVar9];
      dVar9 = (double)((long)dVar9 + 1);
      pdVar7 = pdVar7 + lVar8;
    } while ((double)local_348._M_allocated_capacity != dVar9);
  }
  local_258._0_8_ = &DAT_402b000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,local_2f8.m_storage.m_cols,(scalar_constant_op<double> *)local_258
                  );
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_290,(Lhs *)local_358,(Rhs *)&local_2f8,
                  (scalar_product_op<double,_double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_220,(Lhs *)local_290,&local_2e0,
                  (scalar_product_op<double,_double> *)local_358);
  local_2c8.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)&DAT_3fd5555555555555;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,
                   local_2e0.super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>.m_storage
                   .m_cols,(scalar_constant_op<double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                   *)local_258,&local_2e0,(Rhs *)local_358,
                  (scalar_difference_op<double,_double> *)&local_310);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                   *)local_1b8,(Lhs *)local_220,(Rhs *)local_258,
                  (scalar_product_op<double,_double> *)local_358);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             __return_storage_ptr__,8);
  local_360 = (PointerType)sStack_190.m_other;
  pdVar2 = (local_188->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  pdVar3 = (local_178->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar1 = *local_168.m_value;
  local_318 = (PointerType)local_150.m_other;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>,double,double>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
              *)local_1b8,(assign_op<double,_double> *)&local_2c8);
  if (0 < (long)local_348._M_allocated_capacity) {
    lVar8 = *(Index *)(local_348._8_8_ + 8);
    dVar9 = 0.0;
    pdVar7 = (double *)local_358._0_8_;
    do {
      *pdVar7 = (*(double *)(lVar1 + (long)dVar9 * 8) - (double)local_318) *
                pdVar2[(long)dVar9] * (double)local_360 * pdVar3[(long)dVar9];
      dVar9 = (double)((long)dVar9 + 1);
      pdVar7 = pdVar7 + lVar8;
    } while ((double)local_348._M_allocated_capacity != dVar9);
  }
  local_258._0_8_ = (PointerType)0x403b000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)local_358,1,
                   local_2e0.super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>.m_storage
                   .m_cols,(scalar_constant_op<double> *)local_258);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_290,(Lhs *)local_358,&local_2e0,
                  (scalar_product_op<double,_double> *)&local_2c8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_220,(Lhs *)local_290,(Rhs *)&local_308,
                  (scalar_product_op<double,_double> *)local_358);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                   *)local_1b8,(Lhs *)local_220,(Rhs *)&local_2f8,
                  (scalar_product_op<double,_double> *)local_358);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             __return_storage_ptr__,9);
  local_360 = (PointerType)sStack_190.m_other;
  pdVar2 = (local_188->super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_data;
  pdVar3 = (local_178->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar1 = *local_168.m_value;
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Array<double,1,_1,1,1,_1>const>,double,double>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_358,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
              *)local_1b8,(assign_op<double,_double> *)local_258);
  if (0 < (long)local_348._M_allocated_capacity) {
    lVar8 = *(Index *)(local_348._8_8_ + 8);
    dVar9 = 0.0;
    pdVar7 = (double *)local_358._0_8_;
    do {
      *pdVar7 = pdVar2[(long)dVar9] * (double)local_360 * pdVar3[(long)dVar9] *
                *(double *)(lVar1 + (long)dVar9 * 8);
      dVar9 = (double)((long)dVar9 + 1);
      pdVar7 = pdVar7 + lVar8;
    } while ((double)local_348._M_allocated_capacity != dVar9);
  }
  free(local_2f8.m_storage.m_data);
  free(local_308.m_storage.m_data);
  free(local_2e0.super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 2,
                  "Reference coordinates must be 2-vectors");
    // number of points for which evaluation is desired
    const size_type n_pts(refcoords.cols());
    // Matrix for returning the values of the reference shape functions at the
    // specified nodes. Each row corresponds to a reference shape function
    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(10, n_pts);

    // evaluation of the barycentric coordinate functions
    const Eigen::Array<double, 1, Eigen::Dynamic> lambda0 =
        1 - refcoords.row(0).array() - refcoords.row(1).array();
    const Eigen::Array<double, 1, Eigen::Dynamic> lambda1 =
        refcoords.row(0).array();
    const Eigen::Array<double, 1, Eigen::Dynamic> lambda2 =
        refcoords.row(1).array();

    // evaluation of the shape functions
    // The LSF associated with vertices
    result.row(0) = 4.5 * lambda0 * (lambda0 - 1 / 3.0) * (lambda0 - 2 / 3.0);
    result.row(1) = 4.5 * lambda1 * (lambda1 - 1 / 3.0) * (lambda1 - 2 / 3.0);
    result.row(2) = 4.5 * lambda2 * (lambda2 - 1 / 3.0) * (lambda2 - 2 / 3.0);
    // Six LSF are attached to edges
    result.row(3) = 13.5 * lambda0 * lambda1 * (lambda0 - 1 / 3.0);
    result.row(4) = 13.5 * lambda0 * lambda1 * (lambda1 - 1 / 3.0);
    result.row(5) = 13.5 * lambda1 * lambda2 * (lambda1 - 1 / 3.0);
    result.row(6) = 13.5 * lambda1 * lambda2 * (lambda2 - 1 / 3.0);
    result.row(7) = 13.5 * lambda2 * lambda0 * (lambda2 - 1 / 3.0);
    result.row(8) = 13.5 * lambda2 * lambda0 * (lambda0 - 1 / 3.0);
    // LSF associated with the cell: cubic bubble function
    result.row(9) = 27.0 * lambda0 * lambda1 * lambda2;

    return result;
  }